

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<FPolySeg,_FPolySeg>::DoCopy
          (TArray<FPolySeg,_FPolySeg> *this,TArray<FPolySeg,_FPolySeg> *other)

{
  uint uVar1;
  FPolySeg *pFVar2;
  uint local_1c;
  uint i;
  TArray<FPolySeg,_FPolySeg> *other_local;
  TArray<FPolySeg,_FPolySeg> *this_local;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if (this->Count == 0) {
    this->Array = (FPolySeg *)0x0;
  }
  else {
    pFVar2 = (FPolySeg *)
             M_Malloc_Dbg((ulong)this->Most * 0x28,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                          ,0x199);
    this->Array = pFVar2;
    for (local_1c = 0; local_1c < this->Count; local_1c = local_1c + 1) {
      FPolySeg::FPolySeg(this->Array + local_1c,other->Array + local_1c);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}